

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
           *this,int to_move,
          btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  bVar4;
  bool bVar5;
  undefined8 uVar6;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar7;
  uint uVar8;
  char *__function;
  long lVar9;
  long lVar10;
  long lVar11;
  size_type n;
  int iVar12;
  int i;
  ulong uVar13;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_0021d9b9;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ab,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ac,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                 );
  }
  bVar4 = right[10];
  if ((byte)this[10] < (byte)bVar4) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ad,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ae,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                 );
  }
  if ((int)(uint)(byte)this[10] < to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8af,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                 );
  }
  lVar11 = (long)to_move;
  if ((int)(uint)(byte)bVar4 < to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar4,0,(ulong)(uint)to_move,right,alloc);
    if ((*(ulong *)this & 7) == 0) {
      uVar13 = lVar11 - 1;
      puVar3 = (undefined8 *)(*(ulong *)this + 0xc + (ulong)(byte)this[8] * 0x10);
      uVar6 = puVar3[1];
      *(undefined8 *)(right + (uVar13 & 0xffffffff) * 0x10 + 0xc) = *puVar3;
      *(undefined8 *)(right + (uVar13 & 0xffffffff) * 0x10 + 0xc + 8) = uVar6;
      n = (size_type)(int)(~(uint)(byte)right[10] + to_move);
      uninitialized_move_n(this,n,(byte)this[10] - n,(ulong)(byte)right[10],right,alloc);
      if (n != uVar13) {
        bVar4 = this[10];
        lVar9 = 0xc;
        do {
          pbVar7 = this + lVar9 + (ulong)(byte)bVar4 * 0x10 + (long)(int)uVar13 * -0x10;
          *(undefined4 *)(right + lVar9) = *(undefined4 *)pbVar7;
          *(undefined4 *)(right + lVar9 + 4) = *(undefined4 *)(pbVar7 + 4);
          *(undefined4 *)(right + lVar9 + 8) = *(undefined4 *)(pbVar7 + 8);
          *(undefined4 *)(right + lVar9 + 0xc) = *(undefined4 *)(pbVar7 + 0xc);
          lVar9 = lVar9 + 0x10;
        } while (pbVar7 + 0x10 != this + ((byte)bVar4 - n) * 0x10 + 0xc);
      }
LAB_0021d88b:
      uVar13 = *(ulong *)this;
      if ((uVar13 & 7) == 0) {
        lVar9 = ((ulong)(byte)this[10] - lVar11) * 0x10;
        lVar11 = (ulong)(byte)this[8] * 0x10;
        *(undefined4 *)(uVar13 + 0xc + lVar11) = *(undefined4 *)(this + lVar9 + 0xc);
        *(undefined4 *)(uVar13 + 0x10 + lVar11) = *(undefined4 *)(this + lVar9 + 0x10);
        *(undefined4 *)(uVar13 + 0x14 + lVar11) = *(undefined4 *)(this + lVar9 + 0x14);
        *(undefined4 *)(uVar13 + 0x18 + lVar11) = *(undefined4 *)(this + lVar9 + 0x18);
        if (this[0xb] ==
            (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
             )0x0) {
          uVar13 = (ulong)(byte)right[10];
          do {
            pbVar7 = child(right,uVar13);
            init_child(right,to_move + (int)uVar13,pbVar7);
            mutable_child(right,uVar13);
            bVar5 = 0 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar5);
          iVar12 = 1;
          if (1 < to_move) {
            iVar12 = to_move;
          }
          i = 0;
          do {
            iVar1 = (1 - to_move) + i;
            pbVar7 = child(this,(long)(int)((uint)(byte)this[10] + iVar1));
            init_child(right,i,pbVar7);
            mutable_child(this,(long)(int)((uint)(byte)this[10] + iVar1));
            i = i + 1;
          } while (iVar12 != i);
        }
        this[10] = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar4 - to_move),
               (ulong)(byte)bVar4,right,alloc);
    bVar4 = right[10];
    if ((to_move < (int)(uint)(byte)bVar4) &&
       (uVar8 = ~to_move + (uint)(byte)bVar4, -1 < (int)uVar8)) {
      lVar9 = (ulong)uVar8 * 0x10 + 0x1c;
      pbVar7 = right + (ulong)(byte)bVar4 * 0x10;
      do {
        *(undefined4 *)(pbVar7 + -4) = *(undefined4 *)(right + lVar9 + -0x10);
        *(undefined4 *)pbVar7 = *(undefined4 *)(right + lVar9 + -0xc);
        *(undefined4 *)(pbVar7 + 4) = *(undefined4 *)(right + lVar9 + -8);
        *(undefined4 *)(pbVar7 + 8) = *(undefined4 *)(right + lVar9 + -4);
        lVar9 = lVar9 + -0x10;
        pbVar7 = pbVar7 + -0x10;
      } while (0x1b < lVar9);
    }
    uVar13 = *(ulong *)this;
    if ((uVar13 & 7) == 0) {
      lVar9 = (ulong)(byte)this[8] * 0x10;
      uVar2 = lVar11 - 1;
      lVar10 = (uVar2 & 0xffffffff) * 0x10;
      *(undefined4 *)(right + lVar10 + 0xc) = *(undefined4 *)(uVar13 + 0xc + lVar9);
      *(undefined4 *)(right + lVar10 + 0x10) = *(undefined4 *)(uVar13 + 0x10 + lVar9);
      *(undefined4 *)(right + lVar10 + 0x14) = *(undefined4 *)(uVar13 + 0x14 + lVar9);
      *(undefined4 *)(right + lVar10 + 0x18) = *(undefined4 *)(uVar13 + 0x18 + lVar9);
      if (uVar2 != 0) {
        bVar4 = this[10];
        lVar9 = 0xc;
        do {
          pbVar7 = this + lVar9 + (ulong)(byte)bVar4 * 0x10 + (long)(int)uVar2 * -0x10;
          *(undefined4 *)(right + lVar9) = *(undefined4 *)pbVar7;
          *(undefined4 *)(right + lVar9 + 4) = *(undefined4 *)(pbVar7 + 4);
          *(undefined4 *)(right + lVar9 + 8) = *(undefined4 *)(pbVar7 + 8);
          *(undefined4 *)(right + lVar9 + 0xc) = *(undefined4 *)(pbVar7 + 0xc);
          lVar9 = lVar9 + 0x10;
        } while (pbVar7 + 0x10 != this + (ulong)(byte)bVar4 * 0x10 + 0xc);
      }
      goto LAB_0021d88b;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_0021d9b9:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(count() >= right->count());
        assert(to_move >= 1);
        assert(to_move <= count());

        // Values in the right node are shifted to the right to make room for the
        // new to_move values. Then, the delimiting value in the parent and the
        // other (to_move - 1) values in the left node are moved into the right node.
        // Lastly, a new delimiting value is moved from the left node into the
        // parent, and the remaining empty left node entries are destroyed.

        if (right->count() >= to_move) {
            // The original location of the right->count() values are sufficient to hold
            // the new to_move entries from the parent and left node.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(to_move, right->count() - to_move,
                                        right->count(), right, alloc);
            if (right->count() > to_move) {
                for (slot_type *src = right->slot(right->count() - to_move - 1),
                         *dest = right->slot(right->count() - 1),
                         *end = right->slot(0);
                     src >= end; --src, --dest) {
                    params_type::move(alloc, src, dest);
                }
            }

            // 2) Move the delimiting value in the parent to the right node.
            params_type::move(alloc, parent()->slot(position()),
                              right->slot(to_move - 1));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            params_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                              right->slot(0));
        } else {
            // The right node does not have enough initialized space to hold the new
            // to_move entries, so part of them will move to uninitialized space.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

            // 2) Move the delimiting value in the parent to the right node.
            right->value_init(to_move - 1, alloc, parent()->slot(position()));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            const size_type uninitialized_remaining = to_move - right->count() - 1;
            uninitialized_move_n(uninitialized_remaining,
                                 count() - uninitialized_remaining, right->count(),
                                 right, alloc);
            params_type::move(alloc, slot(count() - (to_move - 1)),
                              slot(count() - uninitialized_remaining), right->slot(0));
        }

        // 4) Move the new delimiting value to the parent from the left node.
        params_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

        // 5) Destroy the now-empty to_move entries in the left node.
        value_destroy_n(count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the left to the right node.
            for (int i = right->count(); i >= 0; --i) {
                right->init_child(i + to_move, right->child(i));
                right->clear_child(i);
            }
            for (int i = 1; i <= to_move; ++i) {
                right->init_child(i - 1, child(count() - to_move + i));
                clear_child(count() - to_move + i);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() - to_move));
        right->set_count((field_type)(right->count() + to_move));
    }